

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7.c
# Opt level: O3

int add_attribute_string(stack_st_X509_ATTRIBUTE *attrs,int nid,char *buffer)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  uint len;
  char *pcVar4;
  ASN1_STRING *pAVar5;
  size_t sVar6;
  X509_ATTRIBUTE *pXVar7;
  ASN1_STRING *str;
  BIO_METHOD *pBVar8;
  BIO *pBVar9;
  PKCS7 *pPVar10;
  char **b;
  stack_st_PKCS7_SIGNER_INFO *psVar11;
  FILE *pFVar12;
  FILE *pFVar13;
  X509_STORE *ctx;
  X509_STORE_CTX *ctx_00;
  FILE *pFVar14;
  FILE *b_00;
  X509 **ppXVar15;
  ulong uVar16;
  void *__src;
  char *pcVar17;
  ASN1_OBJECT *a;
  ASN1_TYPE *pAVar18;
  X509_CRL *x;
  X509 *pXVar19;
  X509_NAME *pXVar20;
  X509_NAME *b_01;
  FILE *pFVar21;
  ASN1_INTEGER *x_00;
  X509_EXTENSION *pXVar22;
  ulong uVar23;
  int in_ECX;
  int *piVar24;
  EVP_PKEY **buffer_00;
  ulong uVar25;
  uint extraout_EDX;
  char *data;
  FILE *extraout_RDX;
  undefined8 uVar26;
  int n;
  FILE *pFVar27;
  ASN1_STRING *pAVar28;
  char *pcVar29;
  int *piVar30;
  long lVar31;
  X509 *pXVar32;
  char **__size;
  uint uStack_264c;
  PKCS7 *pPStack_2648;
  BIO *pBStack_2640;
  long lStack_2638;
  byte abStack_2630 [64];
  char acStack_25f0 [1024];
  char acStack_21f0 [1032];
  FILE *pFStack_1de8;
  int *piStack_1de0;
  X509 *pXStack_1dd8;
  FILE *pFStack_1dd0;
  char **ppcStack_1dc8;
  FILE *pFStack_1dc0;
  int aiStack_1db8 [258];
  FILE *pFStack_19b0;
  int *piStack_19a8;
  X509 *pXStack_19a0;
  X509_CRL *pXStack_1998;
  FILE *pFStack_1990;
  FILE *pFStack_1988;
  FILE aFStack_1980 [4];
  FILE aFStack_1580 [4];
  char acStack_1180 [2056];
  FILE *pFStack_978;
  FILE *pFStack_970;
  FILE *pFStack_968;
  X509_CRL *pXStack_960;
  FILE *pFStack_958;
  FILE *pFStack_950;
  X509_CRL *pXStack_940;
  FILE *pFStack_938;
  FILE *pFStack_930;
  FILE *pFStack_928;
  X509_CRL *pXStack_920;
  FILE *pFStack_918;
  code *pcStack_910;
  X509_CRL *pXStack_900;
  FILE *pFStack_8f8;
  FILE *pFStack_8f0;
  FILE *pFStack_8e8;
  FILE *pFStack_8e0;
  FILE *pFStack_8d8;
  undefined1 auStack_8c8 [1040];
  ASN1_STRING *pAStack_4b8;
  FILE *pFStack_4b0;
  X509_STORE *pXStack_4a8;
  X509_STORE_CTX *pXStack_4a0;
  FILE *pFStack_498;
  FILE *pFStack_490;
  undefined1 auStack_488 [1032];
  ASN1_STRING *pAStack_80;
  ASN1_STRING *pAStack_78;
  
  pcVar29 = pname;
  if (d_flag != 0) {
    pcVar4 = OBJ_nid2sn(nid);
    printf("%s: adding string attribute %s\n",pcVar29,pcVar4);
  }
  pAVar5 = ASN1_STRING_new();
  sVar6 = strlen(buffer);
  pAVar28 = pAVar5;
  iVar2 = ASN1_STRING_set(pAVar5,buffer,(int)sVar6);
  n = (int)buffer;
  if (0 < iVar2) {
    pXVar7 = X509_ATTRIBUTE_create(nid,0x13,pAVar5);
    OPENSSL_sk_push(attrs,pXVar7);
    return 0;
  }
  add_attribute_string_cold_1();
  pcVar29 = pname;
  if (d_flag != 0) {
    pcVar4 = OBJ_nid2sn(n);
    printf("%s: adding octet attribute %s\n",pcVar29,pcVar4);
  }
  str = ASN1_STRING_new();
  pcVar29 = data;
  pAVar5 = str;
  iVar2 = ASN1_STRING_set(str,data,in_ECX);
  if (0 < iVar2) {
    pXVar7 = X509_ATTRIBUTE_create(n,4,str);
    OPENSSL_sk_push(pAVar28,pXVar7);
    return 0;
  }
  add_attribute_octet_cold_1();
  pFStack_490 = (FILE *)0x10cb97;
  pAStack_80 = pAVar28;
  pAStack_78 = str;
  pBVar8 = BIO_s_mem();
  pFStack_490 = (FILE *)0x10cb9f;
  pBVar9 = BIO_new(pBVar8);
  if (v_flag != 0) {
    pFStack_490 = (FILE *)0x10cbc6;
    printf("%s: reading outer PKCS#7\n",pname);
  }
  pFStack_490 = (FILE *)0x10cbdb;
  uVar3 = BIO_write(pBVar9,*(void **)(pAVar5 + 8),*(int *)&pAVar5[8].data);
  if ((int)uVar3 < 1) {
    pFStack_490 = (FILE *)0x10cf65;
    pkcs7_verify_unwrap_cold_12();
LAB_0010cf65:
    pFStack_490 = (FILE *)0x10cf6a;
    pkcs7_verify_unwrap_cold_11();
LAB_0010cf6a:
    pFStack_490 = (FILE *)0x10cf6f;
    pkcs7_verify_unwrap_cold_1();
LAB_0010cf6f:
    pFStack_490 = (FILE *)0x10cf74;
    pkcs7_verify_unwrap_cold_10();
  }
  else {
    if (v_flag != 0) {
      pFStack_490 = (FILE *)0x10cc09;
      printf("%s: PKCS#7 payload size: %d bytes\n",pname,(ulong)uVar3);
    }
    pFStack_490 = (FILE *)0x10cc16;
    BIO_set_flags(pBVar9,0x200);
    pFStack_490 = (FILE *)0x10cc20;
    pPVar10 = d2i_PKCS7_bio(pBVar9,(PKCS7 **)0x0);
    pAVar5[7].flags = (long)pPVar10;
    if (pPVar10 == (PKCS7 *)0x0) goto LAB_0010cf65;
    if (d_flag != 0) {
      pFStack_490 = (FILE *)0x10cc54;
      printf("%s: printing PEM fomatted PKCS#7\n",pname);
      pFStack_490 = (FILE *)0x10cc6a;
      PEM_write_PKCS7(_stdout,(PKCS7 *)pAVar5[7].flags);
      pPVar10 = (PKCS7 *)pAVar5[7].flags;
    }
    pFStack_490 = (FILE *)0x10cc7a;
    iVar2 = OBJ_obj2nid(pPVar10->type);
    if (iVar2 != 0x16) goto LAB_0010cf6a;
    pFStack_490 = (FILE *)0x10cc91;
    pBVar9 = PKCS7_dataInit((PKCS7 *)pAVar5[7].flags,(BIO *)0x0);
    if (pBVar9 == (BIO *)0x0) goto LAB_0010cf6f;
    pFStack_490 = (FILE *)0x10cca2;
    pBVar8 = BIO_s_mem();
    pFStack_490 = (FILE *)0x10ccaa;
    b = (char **)BIO_new(pBVar8);
    pFStack_490 = (FILE *)0x10ccbd;
    uVar3 = BIO_read(pBVar9,auStack_488,0x400);
    len = uVar3;
    while (0 < (int)len) {
      pFStack_490 = (FILE *)0x10ccd5;
      BIO_write((BIO *)b,auStack_488,len);
      pFStack_490 = (FILE *)0x10cce5;
      len = BIO_read(pBVar9,auStack_488,0x400);
      uVar3 = uVar3 + len;
    }
    pFStack_490 = (FILE *)0x10ccfc;
    BIO_ctrl((BIO *)b,0xb,0,(void *)0x0);
    if (v_flag != 0) {
      pFStack_490 = (FILE *)0x10cd22;
      printf("%s: PKCS#7 contains %d bytes of signed data\n",pname,(ulong)uVar3);
    }
    pFStack_490 = (FILE *)0x10cd2e;
    psVar11 = PKCS7_get_signer_info((PKCS7 *)pAVar5[7].flags);
    if (psVar11 != (stack_st_PKCS7_SIGNER_INFO *)0x0) {
      if (v_flag != 0) {
        pFStack_490 = (FILE *)0x10cd5e;
        printf("%s: verifying signature\n",pname);
      }
      pFStack_490 = (FILE *)0x10cd68;
      pFVar12 = (FILE *)OPENSSL_sk_value(psVar11,0);
      pFStack_490 = (FILE *)0x10cd7a;
      pFVar13 = (FILE *)PKCS7_cert_from_signer_info
                                  ((PKCS7 *)pAVar5[7].flags,(PKCS7_SIGNER_INFO *)pFVar12);
      if (pFVar13 == (FILE *)0x0) {
        pFStack_490 = (FILE *)0x10cd9a;
        printf("%s: Can\'t read signer cert from pkcs7\n",pname);
      }
      pFStack_490 = (FILE *)0x10cdaf;
      iVar2 = PKCS7_signatureVerify
                        (pBVar9,(PKCS7 *)pAVar5[7].flags,(PKCS7_SIGNER_INFO *)pFVar12,
                         (X509 *)pFVar13);
      if (iVar2 < 1) goto LAB_0010cf79;
      if (v_flag != 0) {
        pFStack_490 = (FILE *)0x10cddb;
        printf("%s: signature ok\n");
      }
      pFStack_490 = (FILE *)0x10cde0;
      ctx = X509_STORE_new();
      if (ctx == (X509_STORE *)0x0) {
        pFStack_490 = (FILE *)0x10cf3d;
        pkcs7_verify_unwrap_cold_2();
      }
      pFStack_490 = (FILE *)0x10cdf6;
      X509_STORE_set_flags(ctx,0);
      pFStack_490 = (FILE *)0x10ce03;
      X509_STORE_load_locations(ctx,pcVar29,(char *)0x0);
      pFStack_490 = (FILE *)0x10ce08;
      ctx_00 = X509_STORE_CTX_new();
      if (ctx_00 == (X509_STORE_CTX *)0x0) {
        pFStack_490 = (FILE *)0x10cf47;
        pkcs7_verify_unwrap_cold_3();
      }
      buffer_00 = (EVP_PKEY **)0x0;
      pFStack_490 = (FILE *)0x10ce24;
      iVar2 = X509_STORE_CTX_init(ctx_00,ctx,(X509 *)pFVar13,(stack_st_X509 *)0x0);
      if (iVar2 == 0) {
        pFStack_490 = (FILE *)0x10cf51;
        pkcs7_verify_unwrap_cold_4();
      }
      pFStack_490 = (FILE *)0x10ce34;
      iVar2 = X509_verify_cert(ctx_00);
      if (iVar2 == 0) {
        pFStack_490 = (FILE *)0x10cf5b;
        pkcs7_verify_unwrap_cold_5();
      }
      pFVar14 = pFVar12;
      if (w_flag == 0) {
LAB_0010cefa:
        pFStack_490 = (FILE *)0x10cf04;
        pFVar21 = (FILE *)b;
        pPVar10 = d2i_PKCS7_bio((BIO *)b,(PKCS7 **)0x0);
        pAVar5[7].flags = (long)pPVar10;
        if (pPVar10 != (PKCS7 *)0x0) {
          pFStack_490 = (FILE *)0x10cf1c;
          X509_STORE_free(ctx);
          pFStack_490 = (FILE *)0x10cf24;
          X509_STORE_CTX_cleanup(ctx_00);
          return 0;
        }
        pFStack_490 = (FILE *)0x10cfaf;
        pkcs7_verify_unwrap_cold_8();
        pFVar12 = pFVar14;
LAB_0010cfaf:
        pFVar14 = pFVar12;
        pFStack_490 = (FILE *)0x10cfb4;
        pkcs7_verify_unwrap_cold_7();
      }
      else {
        pFStack_490 = (FILE *)0x10ce62;
        pFVar21 = (FILE *)w_char;
        pFVar14 = fopen(w_char,"w");
        if (pFVar14 == (FILE *)0x0) goto LAB_0010cfaf;
        if (v_flag != 0) {
          pFStack_490 = (FILE *)0x10ce92;
          printf("%s: writing cert\n",w_char);
        }
        if (d_flag != 0) {
          pFStack_490 = (FILE *)0x10ceb0;
          PEM_write_X509(_stdout,(X509 *)pFVar13);
        }
        pFStack_490 = (FILE *)0x10cebb;
        pFVar21 = pFVar14;
        iVar2 = PEM_write_X509(pFVar14,(X509 *)pFVar13);
        if (iVar2 == 1) {
          if (v_flag != 0) {
            pFStack_490 = (FILE *)0x10cef2;
            printf("%s: certificate written as %s\n",pname,w_char);
          }
          pFStack_490 = (FILE *)0x10cefa;
          fclose(pFVar14);
          goto LAB_0010cefa;
        }
      }
      pFStack_490 = (FILE *)pkcs7_unwrap;
      pkcs7_verify_unwrap_cold_6();
      pFStack_8d8 = (FILE *)0x10cfd2;
      pAStack_4b8 = pAVar5;
      pFStack_4b0 = pFVar13;
      pXStack_4a8 = ctx;
      pXStack_4a0 = ctx_00;
      pFStack_498 = (FILE *)b;
      pFStack_490 = pFVar14;
      pBVar8 = BIO_s_mem();
      pFStack_8d8 = (FILE *)0x10cfda;
      pFVar12 = (FILE *)BIO_new(pBVar8);
      piVar30 = &v_flag;
      if (v_flag != 0) {
        pFStack_8d8 = (FILE *)0x10d003;
        printf("%s: reading outer PKCS#7\n",pname);
      }
      pFVar27 = *(FILE **)&pFVar21->_mode;
      pFStack_8d8 = (FILE *)0x10d018;
      pcVar29 = (char *)pFVar12;
      uVar3 = BIO_write((BIO *)pFVar12,pFVar27,*(int *)(pFVar21->_unused2 + 4));
      if ((int)uVar3 < 1) {
        pFStack_8d8 = (FILE *)0x10d6bd;
        pkcs7_unwrap_cold_20();
LAB_0010d6bd:
        pFStack_8d8 = (FILE *)0x10d6c2;
        pkcs7_unwrap_cold_1();
LAB_0010d6c2:
        pFStack_8d8 = (FILE *)0x10d6c7;
        pkcs7_unwrap_cold_19();
LAB_0010d6c7:
        pFStack_8d8 = (FILE *)0x10d6cc;
        pkcs7_unwrap_cold_18();
LAB_0010d6cc:
        pFStack_8d8 = (FILE *)0x10d6d1;
        pkcs7_unwrap_cold_17();
LAB_0010d6d1:
        pFStack_8d8 = (FILE *)0x10d6d6;
        pkcs7_unwrap_cold_16();
LAB_0010d6d6:
        pcVar4 = (char *)pFVar13;
        pFStack_8d8 = (FILE *)0x10d6db;
        pkcs7_unwrap_cold_2();
LAB_0010d6db:
        pFStack_8d8 = (FILE *)0x10d6e0;
        pkcs7_unwrap_cold_3();
LAB_0010d6e0:
        pFStack_8d8 = (FILE *)0x10d6e5;
        pkcs7_unwrap_cold_4();
LAB_0010d6e5:
        pFStack_8d8 = (FILE *)0x10d6ea;
        pkcs7_unwrap_cold_5();
LAB_0010d6ea:
        pFStack_8d8 = (FILE *)0x10d6ef;
        pkcs7_unwrap_cold_6();
LAB_0010d6ef:
        pFStack_8d8 = (FILE *)0x10d6f4;
        pkcs7_unwrap_cold_8();
LAB_0010d6f4:
        pFStack_8d8 = (FILE *)0x10d6f9;
        pkcs7_unwrap_cold_14();
LAB_0010d6f9:
        pFVar13 = pFVar14;
        pFStack_8d8 = (FILE *)0x10d6fe;
        pkcs7_unwrap_cold_13();
LAB_0010d6fe:
        pFStack_8d8 = (FILE *)0x10d703;
        pkcs7_unwrap_cold_12();
LAB_0010d703:
        pFStack_8d8 = (FILE *)0x10d708;
        pkcs7_unwrap_cold_15();
        pFVar14 = pFVar13;
LAB_0010d708:
        pFStack_8d8 = (FILE *)0x10d70d;
        pkcs7_unwrap_cold_9();
        auStack_8c8._0_8_ = pcVar29;
      }
      else {
        if (v_flag != 0) {
          pFStack_8d8 = (FILE *)0x10d041;
          printf("%s: PKCS#7 payload size: %d bytes\n",pname,(ulong)uVar3);
        }
        pFStack_8d8 = (FILE *)0x10d04e;
        BIO_set_flags((BIO *)pFVar12,0x200);
        pFVar27 = (FILE *)0x0;
        pFStack_8d8 = (FILE *)0x10d058;
        pPVar10 = d2i_PKCS7_bio((BIO *)pFVar12,(PKCS7 **)0x0);
        pFVar21->__pad5 = (size_t)pPVar10;
        piVar24 = &d_flag;
        buffer_00 = (EVP_PKEY **)piVar24;
        if (d_flag != 0) {
          pFStack_8d8 = (FILE *)0x10d083;
          printf("%s: printing PEM fomatted PKCS#7\n",pname);
          pFVar27 = (FILE *)pFVar21->__pad5;
          pFStack_8d8 = (FILE *)0x10d099;
          PEM_write_PKCS7(_stdout,(PKCS7 *)pFVar27);
          pPVar10 = (PKCS7 *)pFVar21->__pad5;
          buffer_00 = (EVP_PKEY **)piVar24;
        }
        pcVar29 = (char *)pPVar10->type;
        pFStack_8d8 = (FILE *)0x10d0a9;
        iVar2 = OBJ_obj2nid((ASN1_OBJECT *)pcVar29);
        if (iVar2 != 0x16) goto LAB_0010d6bd;
        pcVar29 = (char *)pFVar21->__pad5;
        pFVar27 = (FILE *)0x0;
        pFStack_8d8 = (FILE *)0x10d0c0;
        b_00 = (FILE *)PKCS7_dataInit((PKCS7 *)pcVar29,(BIO *)0x0);
        if (b_00 == (FILE *)0x0) goto LAB_0010d6c2;
        pFStack_8d8 = (FILE *)0x10d0d1;
        pBVar8 = BIO_s_mem();
        pFStack_8d8 = (FILE *)0x10d0d9;
        pFVar12 = (FILE *)BIO_new(pBVar8);
        pFStack_8d8 = (FILE *)0x10d0ee;
        uVar3 = BIO_read((BIO *)b_00,auStack_8c8 + 8,0x400);
        pFVar27 = (FILE *)(ulong)uVar3;
        pFVar14 = pFVar27;
        if (0 < (int)uVar3) {
          pFVar13 = (FILE *)(auStack_8c8 + 8);
          do {
            pFStack_8d8 = (FILE *)0x10d108;
            BIO_write((BIO *)pFVar12,pFVar13,(int)pFVar27);
            pFStack_8d8 = (FILE *)0x10d118;
            uVar3 = BIO_read((BIO *)b_00,pFVar13,0x400);
            pFVar27 = (FILE *)(ulong)uVar3;
            pFVar14 = (FILE *)(ulong)((int)pFVar14 + uVar3);
          } while (0 < (int)uVar3);
        }
        pFVar27 = (FILE *)0xb;
        buffer_00 = (EVP_PKEY **)0x0;
        pFStack_8d8 = (FILE *)0x10d12f;
        BIO_ctrl((BIO *)pFVar12,0xb,0,(void *)0x0);
        if (v_flag != 0) {
          pFStack_8d8 = (FILE *)0x10d150;
          pFVar27 = (FILE *)pname;
          printf("%s: PKCS#7 contains %d bytes of enveloped data\n",pname,pFVar14);
        }
        pcVar29 = (char *)pFVar21->__pad5;
        pFStack_8d8 = (FILE *)0x10d15c;
        psVar11 = PKCS7_get_signer_info((PKCS7 *)pcVar29);
        b = (char **)b_00;
        if (psVar11 == (stack_st_PKCS7_SIGNER_INFO *)0x0) goto LAB_0010d6c7;
        if (v_flag != 0) {
          pFStack_8d8 = (FILE *)0x10d187;
          printf("%s: verifying signature\n",pname);
        }
        pFStack_8d8 = (FILE *)0x10d191;
        pFVar13 = (FILE *)OPENSSL_sk_value(psVar11,0);
        pFVar27 = (FILE *)pFVar21->__pad5;
        pFStack_8d8 = (FILE *)0x10d1b0;
        buffer_00 = (EVP_PKEY **)cacert;
        pcVar29 = (char *)b_00;
        iVar2 = PKCS7_signatureVerify
                          ((BIO *)b_00,(PKCS7 *)pFVar27,(PKCS7_SIGNER_INFO *)pFVar13,(X509 *)cacert)
        ;
        if (iVar2 < 1) goto LAB_0010d6cc;
        if (v_flag != 0) {
          pcVar29 = "%s: signature ok\n";
          pFStack_8d8 = (FILE *)0x10d1d7;
          pFVar27 = (FILE *)pname;
          printf("%s: signature ok\n");
        }
        if (d_flag != 0) {
          pcVar29 = "%s: finding signed attributes\n";
          pFStack_8d8 = (FILE *)0x10d1fb;
          pFVar27 = (FILE *)pname;
          printf("%s: finding signed attributes\n");
        }
        b = (char **)pFVar13->_IO_read_base;
        if ((FILE *)b == (FILE *)0x0) goto LAB_0010d6d1;
        pFVar27 = (FILE *)(ulong)(uint)nid_transId;
        buffer_00 = (EVP_PKEY **)auStack_8c8;
        pFStack_8d8 = (FILE *)0x10d224;
        pcVar29 = (char *)b;
        iVar2 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)b,nid_transId,0x13,(char **)buffer_00);
        pcVar4 = (char *)auStack_8c8._0_8_;
        if (iVar2 != 0) goto LAB_0010d6d6;
        pFStack_8d8 = (FILE *)0x10d24c;
        printf("%s: reply transaction id: %s\n",pname,auStack_8c8._0_8_);
        piVar30 = (int *)pFVar21->_IO_buf_end;
        pFStack_8d8 = (FILE *)0x10d258;
        sVar6 = strlen(pcVar4);
        pFStack_8d8 = (FILE *)0x10d266;
        pFVar27 = (FILE *)pcVar4;
        pcVar29 = (char *)piVar30;
        iVar2 = strncmp((char *)piVar30,pcVar4,sVar6);
        if (iVar2 != 0) goto LAB_0010d6db;
        pFVar27 = (FILE *)(ulong)(uint)nid_messageType;
        buffer_00 = (EVP_PKEY **)auStack_8c8;
        pFStack_8d8 = (FILE *)0x10d289;
        pcVar29 = (char *)b;
        iVar2 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)b,nid_messageType,0x13,(char **)buffer_00);
        piVar30 = &v_flag;
        if (iVar2 != 0) goto LAB_0010d6e0;
        pFStack_8d8 = (FILE *)0x10d2a2;
        pcVar29 = (char *)auStack_8c8._0_8_;
        iVar2 = atoi((char *)auStack_8c8._0_8_);
        if (iVar2 != 3) goto LAB_0010d6e5;
        if (v_flag != 0) {
          pFStack_8d8 = (FILE *)0x10d2ca;
          printf("%s: reply message type is good\n",pname);
        }
        pFStack_8d8 = (FILE *)0x10d2e5;
        iVar2 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)b,nid_senderNonce,4,(char **)auStack_8c8);
        if (v_flag != 0 && iVar2 != 0) {
          pFStack_8d8 = (FILE *)0x10d6a5;
          fprintf(_stderr,"%s: cannot find senderNonce\n",pname);
        }
        iVar2 = v_flag;
        pFVar21->_markers = (_IO_marker *)auStack_8c8._0_8_;
        if (iVar2 != 0) {
          pFStack_8d8 = (FILE *)0x10d323;
          printf("%s: senderNonce in reply: ",pname);
          pcVar4 = "%02X";
          lVar31 = 0;
          do {
            pFStack_8d8 = (FILE *)0x10d340;
            printf("%02X",(ulong)*(byte *)((long)&pFVar21->_markers->_next + lVar31));
            lVar31 = lVar31 + 1;
          } while (lVar31 != 0x10);
          pFStack_8d8 = (FILE *)0x10d353;
          putchar(10);
        }
        piVar30 = &v_flag;
        pFVar27 = (FILE *)(ulong)(uint)nid_recipientNonce;
        buffer_00 = (EVP_PKEY **)auStack_8c8;
        pFStack_8d8 = (FILE *)0x10d375;
        pcVar29 = (char *)b;
        iVar2 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)b,nid_recipientNonce,4,(char **)buffer_00);
        if (iVar2 != 0) goto LAB_0010d6ea;
        pFVar21->_IO_save_end = (char *)auStack_8c8._0_8_;
        pFVar13 = (FILE *)auStack_8c8._0_8_;
        if (v_flag != 0) {
          pFStack_8d8 = (FILE *)0x10d3a5;
          printf("%s: recipientNonce in reply: ",pname);
          lVar31 = 0;
          do {
            pFStack_8d8 = (FILE *)0x10d3c2;
            printf("%02X",(ulong)(byte)pFVar21->_IO_save_end[lVar31]);
            lVar31 = lVar31 + 1;
          } while (lVar31 != 0x10);
          pFStack_8d8 = (FILE *)0x10d3d5;
          putchar(10);
          pFVar13 = (FILE *)pFVar21->_IO_save_end;
        }
        piVar30 = &v_flag;
        pcVar4 = (char *)&pFVar21->_mode;
        lVar31 = 0;
        do {
          if (pFVar21->_IO_save_base[lVar31] != *(char *)((long)&pFVar13->_flags + lVar31)) {
            if (v_flag != 0) {
              pFStack_8d8 = (FILE *)0x10d6b3;
              pkcs7_unwrap_cold_7();
            }
            break;
          }
          lVar31 = lVar31 + 1;
        } while (lVar31 != 0x10);
        pFVar27 = (FILE *)(ulong)(uint)nid_pkiStatus;
        buffer_00 = (EVP_PKEY **)auStack_8c8;
        pFStack_8d8 = (FILE *)0x10d428;
        pcVar29 = (char *)b;
        iVar2 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)b,nid_pkiStatus,0x13,(char **)buffer_00);
        if (iVar2 != 0) goto LAB_0010d6ef;
        pFStack_8d8 = (FILE *)0x10d43a;
        pcVar29 = (char *)auStack_8c8._0_8_;
        iVar2 = atoi((char *)auStack_8c8._0_8_);
        if (iVar2 == 3) {
          pFStack_8d8 = (FILE *)0x10d534;
          printf("%s: pkistatus: PENDING\n",pname);
          *(undefined4 *)&pFVar21->_IO_write_base = 3;
LAB_0010d53b:
          if (v_flag == 0) {
            return 0;
          }
          if ((int)pFVar14 == 0) {
            return 0;
          }
          pFStack_8d8 = (FILE *)0x10d553;
          pkcs7_unwrap_cold_11();
          return 0;
        }
        if (iVar2 != 2) {
          pFVar13 = pFVar14;
          if (iVar2 == 0) {
            pcVar29 = "%s: pkistatus: SUCCESS\n";
            pFStack_8d8 = (FILE *)0x10d468;
            pFVar27 = (FILE *)pname;
            printf("%s: pkistatus: SUCCESS\n");
            *(undefined4 *)&pFVar21->_IO_write_base = 0;
LAB_0010d4fa:
            if ((int)pFVar14 == 0) goto LAB_0010d6f4;
            if (pFVar21->_flags - 0x13U < 2) {
              ppXVar15 = (X509 **)&pFVar21->_fileno;
              buffer_00 = (EVP_PKEY **)&pFVar21->_old_offset;
            }
            else {
              ppXVar15 = &localcert;
              buffer_00 = &rsa;
            }
            b = (char **)*buffer_00;
            piVar30 = (int *)*ppXVar15;
            pFVar27 = (FILE *)0x0;
            pFStack_8d8 = (FILE *)0x10d570;
            pcVar29 = (char *)pFVar12;
            pFVar13 = (FILE *)d2i_PKCS7_bio((BIO *)pFVar12,(PKCS7 **)0x0);
            if (pFVar13 == (FILE *)0x0) goto LAB_0010d6f9;
            if (d_flag != 0) {
              pFStack_8d8 = (FILE *)0x10d5a0;
              printf("%s: printing PEM fomatted PKCS#7\n",pname);
              pFStack_8d8 = (FILE *)0x10d5b2;
              PEM_write_PKCS7(_stdout,(PKCS7 *)pFVar13);
            }
            pFStack_8d8 = (FILE *)0x10d5b7;
            pBVar8 = BIO_s_mem();
            pFStack_8d8 = (FILE *)0x10d5bf;
            pFVar12 = (FILE *)BIO_new(pBVar8);
            if (d_flag != 0) {
              pFStack_8d8 = (FILE *)0x10d5e6;
              printf("%s: decrypting inner PKCS#7\n",pname);
            }
            pFStack_8d8 = (FILE *)0x10d5fa;
            buffer_00 = (EVP_PKEY **)pFVar12;
            pFVar27 = (FILE *)b;
            pcVar29 = (char *)pFVar13;
            iVar2 = PKCS7_decrypt((PKCS7 *)pFVar13,(EVP_PKEY *)b,(X509 *)piVar30,(BIO *)pFVar12,0);
            if (iVar2 != 0) {
              pFStack_8d8 = (FILE *)0x10d613;
              BIO_ctrl((BIO *)pFVar12,0xb,0,(void *)0x0);
              pFStack_8d8 = (FILE *)0x10d625;
              uVar16 = BIO_ctrl((BIO *)pFVar12,3,0,pcVar4);
              *(int *)(pFVar21->_unused2 + 4) = (int)uVar16;
              if (v_flag != 0) {
                pFStack_8d8 = (FILE *)0x10d651;
                printf("%s: PKCS#7 payload size: %d bytes\n",pname,uVar16 & 0xffffffff);
              }
              pFStack_8d8 = (FILE *)0x10d65e;
              BIO_set_flags((BIO *)pFVar12,0x200);
              pFStack_8d8 = (FILE *)0x10d668;
              pPVar10 = d2i_PKCS7_bio((BIO *)pFVar12,(PKCS7 **)0x0);
              pFVar21->__pad5 = (size_t)pPVar10;
              return 0;
            }
            goto LAB_0010d6fe;
          }
          goto LAB_0010d703;
        }
        pFStack_8d8 = (FILE *)0x10d48c;
        printf("%s: pkistatus: FAILURE\n",pname);
        *(undefined4 *)&pFVar21->_IO_write_base = 2;
        pFVar27 = (FILE *)(ulong)(uint)nid_failInfo;
        buffer_00 = (EVP_PKEY **)auStack_8c8;
        pFStack_8d8 = (FILE *)0x10d4ae;
        pcVar29 = (char *)b;
        iVar2 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)b,nid_failInfo,0x13,(char **)buffer_00);
        if (iVar2 != 0) goto LAB_0010d708;
        pFStack_8d8 = (FILE *)0x10d4c0;
        uVar3 = atoi((char *)auStack_8c8._0_8_);
        if (uVar3 < 5) {
          buffer_00 = (EVP_PKEY **)(ulong)uVar3;
          iVar2 = *(int *)(&DAT_00111428 + (long)buffer_00 * 4);
          *(uint *)&pFVar21->_IO_write_end = uVar3;
          pcVar29 = "%s: reason: %s\n";
          pFStack_8d8 = (FILE *)0x10d4f4;
          pFVar27 = (FILE *)pname;
          printf("%s: reason: %s\n",pname,&DAT_00111428 + iVar2);
          if (*(int *)&pFVar21->_IO_write_base != 0) goto LAB_0010d53b;
          goto LAB_0010d4fa;
        }
      }
      pFStack_8d8 = (FILE *)get_signed_attribute;
      pkcs7_unwrap_cold_10();
      pcStack_910 = (code *)0x10d72d;
      pFStack_8f8 = pFVar21;
      pFStack_8f0 = (FILE *)pcVar4;
      pFStack_8e8 = pFVar12;
      pFStack_8e0 = (FILE *)b;
      pFStack_8d8 = pFVar14;
      iVar2 = get_attribute((stack_st_X509_ATTRIBUTE *)auStack_8c8._0_8_,(int)pFVar27,
                            (ASN1_TYPE **)&pXStack_900);
      if (iVar2 != 0) {
        if (v_flag == 0) {
          return 1;
        }
        pcStack_910 = (code *)0x10d802;
        get_signed_attribute_cold_1();
        return 1;
      }
      pcStack_910 = (code *)0x10d764;
      __size = (char **)pXStack_900;
      uVar3 = ASN1_TYPE_get((ASN1_TYPE *)pXStack_900);
      if (uVar3 == extraout_EDX) {
        pcStack_910 = (code *)0x10d775;
        uVar3 = ASN1_STRING_length((ASN1_STRING *)pXStack_900->sig_alg);
        if ((int)uVar3 < 1) {
          return 1;
        }
        b = (char **)(ulong)uVar3;
        if (d_flag != 0) {
          pcStack_910 = (code *)0x10d7a3;
          pFVar27 = (FILE *)pname;
          printf("%s: allocating %d bytes for attribute\n",pname,b);
        }
        __size = (char **)(ulong)((extraout_EDX == 0x13) + uVar3);
        pcStack_910 = (code *)0x10d7b4;
        pcVar29 = (char *)malloc((size_t)__size);
        *buffer_00 = (EVP_PKEY *)pcVar29;
        if (pcVar29 != (char *)0x0) {
          pcStack_910 = (code *)0x10d7c8;
          __src = (void *)ASN1_STRING_get0_data(pXStack_900->sig_alg);
          pcStack_910 = (code *)0x10d7d9;
          memcpy(pcVar29,__src,(size_t)b);
          if (extraout_EDX != 0x13) {
            return 0;
          }
          (*buffer_00)[(long)b] = (EVP_PKEY)0x0;
          return 0;
        }
      }
      else {
        pcStack_910 = (code *)0x10d80c;
        get_signed_attribute_cold_2();
      }
      pcStack_910 = get_attribute;
      get_signed_attribute_cold_3();
      pcVar29 = pname;
      pXStack_920 = pXStack_900;
      pFVar13 = (FILE *)((ulong)pFVar27 & 0xffffffff);
      pFStack_930 = (FILE *)buffer_00;
      pFStack_928 = (FILE *)pcVar4;
      pFStack_918 = (FILE *)b;
      pcStack_910 = (code *)(ulong)extraout_EDX;
      if (d_flag != 0) {
        pFStack_938 = (FILE *)0x10d83e;
        pcVar17 = OBJ_nid2sn((int)pFVar27);
        pFStack_938 = (FILE *)0x10d852;
        printf("%s: finding attribute %s\n",pcVar29,pcVar17);
        b = (char **)pcVar29;
      }
      *(long *)extraout_RDX = 0;
      pFStack_938 = (FILE *)0x10d860;
      pFVar12 = pFVar13;
      pFVar14 = (FILE *)OBJ_nid2obj((int)pFVar27);
      if (pFVar14 != (FILE *)0x0) {
        pFStack_938 = (FILE *)0x10d870;
        iVar2 = OPENSSL_sk_num(__size);
        if (0 < iVar2) {
          pFVar13 = (FILE *)0x0;
          do {
            pFStack_938 = (FILE *)0x10d880;
            pcVar4 = (char *)OPENSSL_sk_value(__size,pFVar13);
            pFStack_938 = (FILE *)0x10d88b;
            a = X509_ATTRIBUTE_get0_object((X509_ATTRIBUTE *)pcVar4);
            pFStack_938 = (FILE *)0x10d896;
            iVar2 = OBJ_cmp(a,(ASN1_OBJECT *)pFVar14);
            if (iVar2 == 0) {
              pFStack_938 = (FILE *)0x10d8a2;
              pFVar12 = (FILE *)pcVar4;
              iVar2 = X509_ATTRIBUTE_count((X509_ATTRIBUTE *)pcVar4);
              if (iVar2 != 0) {
                if (*(long *)extraout_RDX != 0) {
                  pFStack_938 = (FILE *)0x10d8de;
                  get_attribute_cold_1();
                  b = (char **)pFVar14;
                  goto LAB_0010d8de;
                }
                pFStack_938 = (FILE *)0x10d8b6;
                pAVar18 = X509_ATTRIBUTE_get0_type((X509_ATTRIBUTE *)pcVar4,0);
                *(ASN1_TYPE **)extraout_RDX = pAVar18;
              }
            }
            uVar3 = (int)pFVar13 + 1;
            pFVar13 = (FILE *)(ulong)uVar3;
            pFStack_938 = (FILE *)0x10d8c3;
            iVar2 = OPENSSL_sk_num(__size);
          } while ((int)uVar3 < iVar2);
        }
        return (int)(*(long *)extraout_RDX == 0);
      }
LAB_0010d8de:
      pFStack_938 = (FILE *)0x10d8e3;
      get_attribute_cold_2();
      pFVar12 = *(FILE **)(*(long *)(pFVar12->__pad5 + 0x20) + 0x18);
      pFStack_950 = (FILE *)0x10d8ff;
      pXStack_940 = (X509_CRL *)__size;
      pFStack_938 = (FILE *)b;
      x = (X509_CRL *)OPENSSL_sk_value(pFVar12,0);
      if (x == (X509_CRL *)0x0) {
        pFStack_950 = (FILE *)0x10d9ac;
        write_crl_cold_3();
LAB_0010d9ac:
        pFStack_950 = (FILE *)0x10d9b1;
        write_crl_cold_2();
        pFVar14 = extraout_RDX;
      }
      else {
        b = &w_char;
        pFStack_950 = (FILE *)0x10d921;
        pFVar12 = (FILE *)w_char;
        pFVar14 = fopen(w_char,"w");
        __size = (char **)x;
        if (pFVar14 == (FILE *)0x0) goto LAB_0010d9ac;
        if (v_flag != 0) {
          pFStack_950 = (FILE *)0x10d951;
          printf("%s: writing CRL\n",pname);
        }
        if (d_flag != 0) {
          pFStack_950 = (FILE *)0x10d96f;
          PEM_write_X509_CRL(_stdout,x);
        }
        pFStack_950 = (FILE *)0x10d97a;
        pFVar12 = pFVar14;
        iVar2 = PEM_write_X509_CRL(pFVar14,x);
        if (iVar2 == 1) {
          pFStack_950 = (FILE *)0x10d99a;
          printf("%s: CRL written as %s\n",pname,w_char);
          iVar2 = fclose(pFVar14);
          return iVar2;
        }
      }
      pFStack_950 = (FILE *)write_local_cert;
      write_crl_cold_1();
      localcert = (X509 *)0x0;
      pFVar12 = *(FILE **)(*(long *)(pFVar12->__pad5 + 0x20) + 0x10);
      pFStack_978 = pFVar14;
      pFStack_970 = (FILE *)pcVar4;
      pFStack_968 = (FILE *)piVar30;
      pXStack_960 = (X509_CRL *)__size;
      pFStack_958 = (FILE *)b;
      pFStack_950 = pFVar13;
      if (v_flag != 0) {
        pFStack_1988 = (FILE *)0x10d9f7;
        uVar3 = OPENSSL_sk_num(pFVar12);
        pFStack_1988 = (FILE *)0x10da07;
        printf("write_local_cert(): found %d cert(s)\n",(ulong)uVar3);
      }
      pFStack_1988 = (FILE *)0x10da0f;
      pFVar14 = pFVar12;
      iVar2 = OPENSSL_sk_num();
      pXVar19 = (X509 *)localcert;
      if (0 < iVar2) {
        __size = (char **)0x0;
        do {
          pFStack_1988 = (FILE *)0x10da25;
          pXVar19 = (X509 *)OPENSSL_sk_value(pFVar12,__size);
          pcVar29 = pname;
          if (v_flag != 0) {
            pFStack_1988 = (FILE *)0x10da45;
            pXVar20 = X509_get_subject_name(pXVar19);
            pFStack_1988 = (FILE *)0x10da58;
            pcVar4 = X509_NAME_oneline(pXVar20,(char *)aFStack_1980,0x400);
            pFStack_1988 = (FILE *)0x10da6c;
            printf("%s: found certificate with\n  subject: \'%s\'\n",pcVar29,pcVar4);
            pFStack_1988 = (FILE *)0x10da74;
            pXVar20 = X509_get_issuer_name(pXVar19);
            pFStack_1988 = (FILE *)0x10da84;
            pcVar29 = X509_NAME_oneline(pXVar20,(char *)aFStack_1980,0x400);
            pFStack_1988 = (FILE *)0x10da95;
            printf("  issuer: %s\n",pcVar29);
            pFStack_1988 = (FILE *)0x10daa1;
            pXVar20 = (X509_NAME *)X509_REQ_get_subject_name(request);
            pFStack_1988 = (FILE *)0x10dab1;
            pcVar29 = X509_NAME_oneline(pXVar20,(char *)aFStack_1980,0x400);
            pFStack_1988 = (FILE *)0x10dac2;
            printf("  request_subject: \'%s\'\n",pcVar29);
            pFVar13 = aFStack_1980;
          }
          pFStack_1988 = (FILE *)0x10daca;
          pXVar20 = X509_get_subject_name(pXVar19);
          pFStack_1988 = (FILE *)0x10dad9;
          b_01 = (X509_NAME *)X509_REQ_get_subject_name(request);
          pFStack_1988 = (FILE *)0x10dae4;
          iVar2 = X509_NAME_cmp(pXVar20,b_01);
          if (d_flag != 0) {
            pFStack_1988 = (FILE *)0x10dbc5;
            write_local_cert_cold_1();
          }
          if (iVar2 == 0) {
LAB_0010db6a:
            if (v_flag != 0) {
              pFStack_1988 = (FILE *)0x10db7d;
              puts("CN\'s of request and certificate matched!");
            }
          }
          else {
            pFStack_1988 = (FILE *)0x10db04;
            pXVar20 = X509_get_subject_name(pXVar19);
            pFStack_1988 = (FILE *)0x10db1c;
            X509_NAME_oneline(pXVar20,acStack_1180,0x400);
            pFStack_1988 = (FILE *)0x10db28;
            pXVar20 = (X509_NAME *)X509_REQ_get_subject_name(request);
            pFVar13 = aFStack_1580;
            pFStack_1988 = (FILE *)0x10db40;
            X509_NAME_oneline(pXVar20,(char *)pFVar13,0x400);
            if (v_flag != 0) {
              pFStack_1988 = (FILE *)0x10db5b;
              printf(" X509_NAME_cmp() workaround: strcmp request subject (%s) to cert subject (%s)\n"
                     ,pFVar13,acStack_1180);
            }
            pFStack_1988 = (FILE *)0x10db66;
            iVar2 = strcmp(acStack_1180,(char *)pFVar13);
            if (iVar2 == 0) goto LAB_0010db6a;
            pFStack_1988 = (FILE *)0x10dbcf;
            write_local_cert_cold_2();
          }
          pFStack_1988 = (FILE *)0x10db85;
          b = (char **)X509_get_subject_name(pXVar19);
          pFStack_1988 = (FILE *)0x10db90;
          pXVar20 = X509_get_issuer_name(pXVar19);
          pFStack_1988 = (FILE *)0x10db9b;
          pFVar14 = (FILE *)b;
          iVar2 = X509_NAME_cmp((X509_NAME *)b,pXVar20);
          if (iVar2 != 0) break;
          uVar3 = (int)__size + 1;
          __size = (char **)(ulong)uVar3;
          pFStack_1988 = (FILE *)0x10dbaa;
          pFVar14 = pFVar12;
          iVar2 = OPENSSL_sk_num();
          pXVar19 = (X509 *)localcert;
        } while ((int)uVar3 < iVar2);
      }
      localcert = (X509 *)pXVar19;
      pXVar32 = localcert;
      if (localcert == (X509 *)0x0) {
        pFStack_1988 = (FILE *)0x10dc7f;
        write_local_cert_cold_5();
      }
      else {
        __size = &l_char;
        pFStack_1988 = (FILE *)0x10dc00;
        pFVar14 = (FILE *)l_char;
        pFVar21 = fopen(l_char,"w");
        if (pFVar21 != (FILE *)0x0) {
          if (v_flag != 0) {
            pFStack_1988 = (FILE *)0x10dc2a;
            printf("%s: certificate written as %s\n",pname,l_char);
          }
          if (d_flag != 0) {
            pFStack_1988 = (FILE *)0x10dc4c;
            PEM_write_X509(_stdout,(X509 *)localcert);
          }
          pFStack_1988 = (FILE *)0x10dc5b;
          pFVar14 = pFVar21;
          iVar2 = PEM_write_X509(pFVar21,(X509 *)localcert);
          pFVar12 = pFVar21;
          if (iVar2 == 1) {
            pFStack_1988 = (FILE *)0x10dc68;
            iVar2 = fclose(pFVar21);
            return iVar2;
          }
          goto LAB_0010dc84;
        }
      }
      pFStack_1988 = (FILE *)0x10dc84;
      write_local_cert_cold_4();
LAB_0010dc84:
      pFStack_1988 = (FILE *)write_other_cert;
      write_local_cert_cold_3();
      piStack_19a8 = &v_flag;
      uVar26 = *(undefined8 *)(*(long *)(pFVar14->__pad5 + 0x20) + 0x10);
      pFStack_1dc0 = (FILE *)0x10dcb4;
      pFStack_19b0 = pFVar12;
      pXStack_19a0 = pXVar32;
      pXStack_1998 = (X509_CRL *)__size;
      pFStack_1990 = (FILE *)b;
      pFStack_1988 = pFVar13;
      iVar2 = OPENSSL_sk_num(uVar26);
      piVar30 = &v_flag;
      if (0 < iVar2) {
        pXVar32 = (X509 *)0x0;
        do {
          pFStack_1dc0 = (FILE *)0x10dccd;
          pFVar12 = (FILE *)OPENSSL_sk_value(uVar26,pXVar32);
          pcVar29 = pname;
          if (v_flag != 0) {
            pFStack_1dc0 = (FILE *)0x10dcee;
            pXVar20 = X509_get_subject_name((X509 *)pFVar12);
            pFStack_1dc0 = (FILE *)0x10dcfe;
            pcVar4 = X509_NAME_oneline(pXVar20,(char *)aiStack_1db8,0x400);
            pFStack_1dc0 = (FILE *)0x10dd12;
            printf("%s: found certificate with\n  subject: %s\n",pcVar29,pcVar4);
            pFStack_1dc0 = (FILE *)0x10dd1a;
            pXVar20 = X509_get_issuer_name((X509 *)pFVar12);
            pFStack_1dc0 = (FILE *)0x10dd2a;
            pcVar4 = X509_NAME_oneline(pXVar20,(char *)aiStack_1db8,0x400);
            pFStack_1dc0 = (FILE *)0x10dd3b;
            printf("  issuer: %s\n",pcVar4);
            pFVar13 = (FILE *)pcVar29;
          }
          pFStack_1dc0 = (FILE *)0x10dd43;
          x_00 = X509_get_serialNumber((X509 *)pFVar12);
          pFStack_1dc0 = (FILE *)0x10dd56;
          iVar2 = ASN1_INTEGER_cmp(x_00,*(ASN1_INTEGER **)((long)pFVar14->__pad3 + 8));
          piVar30 = aiStack_1db8;
          if (iVar2 == 0) goto LAB_0010dd73;
          uVar3 = (int)pXVar32 + 1;
          pXVar32 = (X509 *)(ulong)uVar3;
          pFStack_1dc0 = (FILE *)0x10dd65;
          iVar2 = OPENSSL_sk_num(uVar26);
          piVar30 = aiStack_1db8;
        } while ((int)uVar3 < iVar2);
      }
      do {
        pFStack_1dc0 = (FILE *)0x10dd73;
        write_other_cert_cold_3();
LAB_0010dd73:
      } while (pFVar12 == (FILE *)0x0);
      pFStack_1dc0 = (FILE *)0x10dd8e;
      pFVar21 = (FILE *)w_char;
      pFVar27 = fopen(w_char,"w");
      if (pFVar27 == (FILE *)0x0) {
        pFStack_1dc0 = (FILE *)0x10de0a;
        write_other_cert_cold_2();
      }
      else {
        if (v_flag != 0) {
          pFStack_1dc0 = (FILE *)0x10ddbd;
          printf("%s: certificate written as %s\n",pname,w_char);
        }
        if (d_flag != 0) {
          pFStack_1dc0 = (FILE *)0x10dddb;
          PEM_write_X509(_stdout,(X509 *)pFVar12);
        }
        pFStack_1dc0 = (FILE *)0x10dde6;
        pFVar21 = pFVar27;
        iVar2 = PEM_write_X509(pFVar27,(X509 *)pFVar12);
        pFVar14 = pFVar27;
        if (iVar2 == 1) {
          pFStack_1dc0 = (FILE *)0x10ddf3;
          iVar2 = fclose(pFVar27);
          return iVar2;
        }
      }
      pFStack_1dc0 = (FILE *)write_ca_ra;
      write_other_cert_cold_1();
      ppcStack_1dc8 = &w_char;
      pFStack_1de8 = pFVar12;
      piStack_1de0 = piVar30;
      pXStack_1dd8 = pXVar32;
      pFStack_1dd0 = pFVar14;
      pFStack_1dc0 = pFVar13;
      pBVar9 = BIO_new_mem_buf(pFVar21->_IO_read_end,*(int *)&pFVar21->_IO_read_base);
      pPVar10 = d2i_PKCS7_bio(pBVar9,(PKCS7 **)0x0);
      if (pPVar10 == (PKCS7 *)0x0) {
        pcVar29 = "%s: error reading PKCS#7 data\n";
LAB_0010de5c:
        fprintf(_stderr,pcVar29,pname);
LAB_0010de66:
        ERR_print_errors_fp(_stderr);
      }
      else {
        iVar2 = OBJ_obj2nid(pPVar10->type);
        if (iVar2 == 0x16) {
          lVar31 = ((pPVar10->d).data)->flags;
          if (lVar31 != 0) {
            pPStack_2648 = pPVar10;
            pBStack_2640 = pBVar9;
            iVar2 = OPENSSL_sk_num(lVar31);
            if (0 < iVar2) {
              uVar16 = 0;
              lStack_2638 = lVar31;
              do {
                memset(acStack_21f0,0,0x400);
                memset(acStack_25f0,0,0x400);
                pXVar19 = (X509 *)OPENSSL_sk_value(lVar31,uVar16);
                snprintf(acStack_25f0,0x400,"%s-%d",c_char,uVar16);
                pcVar29 = pname;
                if (v_flag != 0) {
                  pXVar20 = X509_get_subject_name(pXVar19);
                  pcVar4 = X509_NAME_oneline(pXVar20,acStack_21f0,0x400);
                  printf("\n%s: found certificate with\n  subject: %s\n",pcVar29,pcVar4);
                  if (v_flag != 0) {
                    pXVar20 = X509_get_issuer_name(pXVar19);
                    pcVar29 = X509_NAME_oneline(pXVar20,acStack_21f0,0x400);
                    printf("  issuer: %s\n",pcVar29);
                  }
                }
                iVar2 = X509_digest(pXVar19,(EVP_MD *)fp_alg,abStack_2630,&uStack_264c);
                if (iVar2 == 0) goto LAB_0010de66;
                iVar2 = X509_get_ext_by_NID(pXVar19,0x57,-1);
                if (iVar2 < 0) {
                  if (v_flag != 0) {
                    puts("  basic constraints: (not included)");
                  }
                }
                else {
                  pXVar22 = X509_get_ext(pXVar19,iVar2);
                  if (v_flag != 0) {
                    printf("  basic constraints: ");
                    X509V3_EXT_print_fp(_stdout,pXVar22,0,0);
                    putchar(10);
                  }
                }
                iVar2 = X509_get_ext_by_NID(pXVar19,0x53,-1);
                if (iVar2 < 0) {
                  if (v_flag != 0) {
                    puts("  usage: (not included)");
                    goto LAB_0010e0d7;
                  }
                }
                else {
                  pXVar22 = X509_get_ext(pXVar19,iVar2);
                  if (v_flag != 0) {
                    printf("  usage: ");
                    X509V3_EXT_print_fp(_stdout,pXVar22,0,0);
                    putchar(10);
LAB_0010e0d7:
                    if (v_flag != 0) {
                      iVar2 = EVP_MD_get_type(fp_alg);
                      pcVar29 = OBJ_nid2sn(iVar2);
                      printf("  %s fingerprint: ",pcVar29);
                      uVar25 = (ulong)uStack_264c;
                      if (0 < (int)uStack_264c) {
                        uVar23 = 0;
                        do {
                          uVar1 = uVar23 + 1;
                          uVar26 = 10;
                          if (uVar1 != (uVar25 & 0xffffffff)) {
                            uVar26 = 0x3a;
                          }
                          printf("%02X%c",(ulong)abStack_2630[uVar23],uVar26);
                          uVar25 = (ulong)(int)uStack_264c;
                          uVar23 = uVar1;
                        } while ((long)uVar1 < (long)uVar25);
                      }
                    }
                  }
                }
                pFVar13 = fopen(acStack_25f0,"w");
                if (pFVar13 == (FILE *)0x0) {
                  pcVar29 = "%s: cannot open cert file for writing\n";
                  goto LAB_0010dea6;
                }
                if (v_flag != 0) {
                  printf("%s: certificate written as %s\n",pname,acStack_25f0);
                }
                if (d_flag != 0) {
                  PEM_write_X509(_stdout,pXVar19);
                }
                iVar2 = PEM_write_X509(pFVar13,pXVar19);
                if (iVar2 != 1) {
                  pcVar29 = "%s: error while writing certificate file\n";
                  goto LAB_0010de5c;
                }
                fclose(pFVar13);
                lVar31 = lStack_2638;
                uVar3 = (int)uVar16 + 1;
                uVar16 = (ulong)uVar3;
                iVar2 = OPENSSL_sk_num(lStack_2638);
              } while ((int)uVar3 < iVar2);
            }
            PKCS7_free(pPStack_2648);
            BIO_free(pBStack_2640);
            exit(0);
          }
          pcVar29 = "%s: cannot find certificates\n";
LAB_0010dea6:
          fprintf(_stderr,pcVar29,pname);
        }
        else {
          printf("%s: wrong PKCS#7 type\n",pname);
        }
      }
      exit(0x5d);
    }
  }
  pFStack_490 = (FILE *)0x10cf79;
  pkcs7_verify_unwrap_cold_9();
LAB_0010cf79:
  pFStack_490 = (FILE *)0x10cf91;
  printf("%s: error verifying signature Error \n",pname);
  pFStack_490 = (FILE *)0x10cfa0;
  ERR_print_errors_fp(_stderr);
  pFStack_490 = (FILE *)0x10cfaa;
  exit(0x61);
}

Assistant:

int add_attribute_string(STACK_OF(X509_ATTRIBUTE) *attrs, int nid, char *buffer){
	ASN1_STRING     *asn1_string = NULL;
	X509_ATTRIBUTE  *x509_a;
	int		c;

	if (d_flag)
		printf("%s: adding string attribute %s\n", pname,
			OBJ_nid2sn(nid));

	asn1_string = ASN1_STRING_new();
	if ((c = ASN1_STRING_set(asn1_string, buffer, strlen(buffer))) <= 0) {
		fprintf(stderr, "%s: error adding data to ASN.1 string\n",
			pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	x509_a = X509_ATTRIBUTE_create(nid, V_ASN1_PRINTABLESTRING,
		asn1_string);
	sk_X509_ATTRIBUTE_push(attrs, x509_a);
	return (0);

}